

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

void __thiscall
winmd::reader::MethodDefSig::MethodDefSig(MethodDefSig *this,table_base *table,byte_view *data)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t count;
  uint uVar3;
  allocator<char> local_59;
  table_base *local_58;
  string local_50;
  
  local_58 = table;
  uVar1 = uncompress_unsigned(data);
  this->m_calling_convention = (CallingConvention)uVar1;
  uVar2 = 0;
  if ((uVar1 & 0x10) != 0) {
    uVar2 = uncompress_unsigned(data);
  }
  this->m_generic_param_count = uVar2;
  uVar1 = uncompress_unsigned(data);
  this->m_param_count = uVar1;
  RetTypeSig::RetTypeSig(&this->m_ret_type,table,data);
  (this->m_params).
  super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_params).
  super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_params).
  super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_param_count <= (uint)(*(int *)&data->m_last - *(int *)&data->m_first)) {
    std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>::reserve
              (&this->m_params,(ulong)this->m_param_count);
    for (uVar3 = 0; uVar3 < this->m_param_count; uVar3 = uVar3 + 1) {
      std::vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>>::
      emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
                ((vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>> *)
                 &this->m_params,&local_58,data);
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Invalid blob array size",&local_59);
  impl::throw_invalid(&local_50);
}

Assistant:

MethodDefSig(table_base const* table, byte_view& data)
            : m_calling_convention(uncompress_enum<CallingConvention>(data))
            , m_generic_param_count(enum_mask(m_calling_convention, CallingConvention::Generic) == CallingConvention::Generic ? uncompress_unsigned(data) : 0)
            , m_param_count(uncompress_unsigned(data))
            , m_ret_type(table, data)
        {
            if (m_param_count > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_params.reserve(m_param_count);
            for (uint32_t count = 0; count < m_param_count; ++count)
            {
                m_params.emplace_back(table, data);
            }
        }